

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString(String *__return_storage_ptr__,longdouble in)

{
  size_type sVar1;
  _Alloc_hider __src;
  size_t sVar2;
  char *__dest;
  size_type sVar3;
  string d;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  longdouble local_1bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  local_1bc = in;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0xf;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<long_double>(local_1bc);
  std::__cxx11::stringbuf::str();
  sVar1 = local_1e0._M_string_length;
  do {
    sVar3 = 0xffffffffffffffff;
    if (sVar1 == 0) break;
    sVar3 = sVar1 - 1;
    sVar1 = sVar3;
  } while (local_1e0._M_dataplus._M_p[sVar3] == '0');
  if (sVar3 != local_1e0._M_string_length - 1 && sVar3 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_1b0,&local_1e0,0,sVar3 + (local_1e0._M_dataplus._M_p[sVar3] == '.') + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_1e0,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  __src._M_p = local_1e0._M_dataplus._M_p;
  sVar2 = strlen(local_1e0._M_dataplus._M_p);
  __dest = String::allocate(__return_storage_ptr__,(uint)sVar2);
  memcpy(__dest,__src._M_p,sVar2 & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

String toString(double long in) { return fpToString(in, 15); }